

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_lsb_encrypt_ecb(void *vblk,int len,BlowfishContext *ctx)

{
  uint32_t local_38;
  uint32_t local_34;
  uint32_t out [2];
  uint32_t xR;
  uint32_t xL;
  uchar *blk;
  BlowfishContext *ctx_local;
  int len_local;
  void *vblk_local;
  
  _xR = vblk;
  ctx_local._4_4_ = len;
  if ((len & 7U) != 0) {
    __assert_fail("(len & 7) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                  ,0x14f,"void blowfish_lsb_encrypt_ecb(void *, int, BlowfishContext *)");
  }
  for (; 0 < ctx_local._4_4_; ctx_local._4_4_ = ctx_local._4_4_ + -8) {
    out[1] = GET_32BIT_LSB_FIRST(_xR);
    out[0] = GET_32BIT_LSB_FIRST((void *)((long)_xR + 4));
    blowfish_encrypt(out[1],out[0],&local_38,ctx);
    PUT_32BIT_LSB_FIRST(_xR,local_38);
    PUT_32BIT_LSB_FIRST((void *)((long)_xR + 4),local_34);
    _xR = (void *)((long)_xR + 8);
  }
  return;
}

Assistant:

void blowfish_lsb_encrypt_ecb(void *vblk, int len, BlowfishContext * ctx)
{
    unsigned char *blk = (unsigned char *)vblk;
    uint32_t xL, xR, out[2];

    assert((len & 7) == 0);

    while (len > 0) {
        xL = GET_32BIT_LSB_FIRST(blk);
        xR = GET_32BIT_LSB_FIRST(blk + 4);
        blowfish_encrypt(xL, xR, out, ctx);
        PUT_32BIT_LSB_FIRST(blk, out[0]);
        PUT_32BIT_LSB_FIRST(blk + 4, out[1]);
        blk += 8;
        len -= 8;
    }
}